

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateParseIterationBody
          (ParseFunctionGenerator *this,Formatter *format,Descriptor *descriptor,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *ordered_fields)

{
  long lVar1;
  undefined8 in_RAX;
  int i;
  long lVar2;
  long lVar3;
  uint32_t end_tag;
  uint32_t start_tag;
  undefined8 local_38;
  
  local_38 = in_RAX;
  Formatter::operator()<>
            (format,"$uint32$ tag;\nptr = ::$proto_ns$::internal::ReadTag(ptr, &tag);\n");
  if ((ordered_fields->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (ordered_fields->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    GenerateFieldSwitch(this,format,ordered_fields);
    Formatter::Outdent(format);
    Formatter::operator()<>(format,"handle_unusual:\n");
    Formatter::Indent(format);
  }
  Formatter::operator()<>
            (format,
             "if ((tag == 0) || ((tag & 7) == 4)) {\n  CHK_(ptr);\n  ctx->SetLastTag(tag);\n  goto message_done;\n}\n"
            );
  if (*(char *)(*(long *)(descriptor + 0x20) + 0x4b) == '\x01') {
    Formatter::operator()<>(format,"$next_tag$;\n");
    return;
  }
  if (0 < *(int *)(descriptor + 0x78)) {
    Formatter::operator()<>(format,"if (");
    lVar3 = 0;
    for (lVar2 = 0; lVar2 < *(int *)(descriptor + 0x78); lVar2 = lVar2 + 1) {
      lVar1 = *(long *)(descriptor + 0x48);
      if (lVar3 != 0) {
        Formatter::operator()<>(format," ||\n    ");
      }
      local_38 = CONCAT44(*(int *)(lVar1 + lVar3) << 3,*(int *)(lVar1 + 4 + lVar3) << 3);
      if (*(int *)(lVar1 + 4 + lVar3) < 0x20000000) {
        Formatter::operator()
                  (format,"($1$u <= tag && tag < $2$u)",(uint *)((long)&local_38 + 4),
                   (uint *)&local_38);
      }
      else {
        Formatter::operator()(format,"($1$u <= tag)",(uint *)((long)&local_38 + 4));
      }
      lVar3 = lVar3 + 0x10;
    }
    Formatter::operator()<>
              (format,
               ") {\n  ptr = $msg$_extensions_.ParseField(tag, ptr, internal_default_instance(), &$msg$_internal_metadata_, ctx);\n  CHK_(ptr != nullptr);\n  $next_tag$;\n}\n"
              );
  }
  Formatter::operator()<>
            (format,
             "ptr = UnknownFieldParse(\n    tag,\n    $msg$_internal_metadata_.mutable_unknown_fields<$unknown_fields_type$>(),\n    ptr, ctx);\nCHK_(ptr != nullptr);\n"
            );
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateParseIterationBody(
    Formatter& format, const Descriptor* descriptor,
    const std::vector<const FieldDescriptor*>& ordered_fields) {
  format(
      "$uint32$ tag;\n"
      "ptr = ::$proto_ns$::internal::ReadTag(ptr, &tag);\n");

  if (!ordered_fields.empty()) {
    GenerateFieldSwitch(format, ordered_fields);
    // Each field `case` only considers field number. Field numbers that are
    // not defined in the message, or tags with an incompatible wire type, are
    // considered "unusual" cases. They will be handled by the logic below.
    format.Outdent();
    format("handle_unusual:\n");
    format.Indent();
  }

  // Unusual/extension/unknown case:
  format(
      "if ((tag == 0) || ((tag & 7) == 4)) {\n"
      "  CHK_(ptr);\n"
      "  ctx->SetLastTag(tag);\n"
      "  goto message_done;\n"
      "}\n");
  if (IsMapEntryMessage(descriptor)) {
    format("$next_tag$;\n");
  } else {
    if (descriptor->extension_range_count() > 0) {
      format("if (");
      for (int i = 0; i < descriptor->extension_range_count(); i++) {
        const Descriptor::ExtensionRange* range =
            descriptor->extension_range(i);
        if (i > 0) format(" ||\n    ");

        uint32_t start_tag = WireFormatLite::MakeTag(
            range->start, static_cast<WireFormatLite::WireType>(0));
        uint32_t end_tag = WireFormatLite::MakeTag(
            range->end, static_cast<WireFormatLite::WireType>(0));

        if (range->end > FieldDescriptor::kMaxNumber) {
          format("($1$u <= tag)", start_tag);
        } else {
          format("($1$u <= tag && tag < $2$u)", start_tag, end_tag);
        }
      }
      format(
          ") {\n"
          "  ptr = $msg$_extensions_.ParseField(tag, ptr, "
          "internal_default_instance(), &$msg$_internal_metadata_, ctx);\n"
          "  CHK_(ptr != nullptr);\n"
          "  $next_tag$;\n"
          "}\n");
    }
    format(
        "ptr = UnknownFieldParse(\n"
        "    tag,\n"
        "    $msg$_internal_metadata_.mutable_unknown_fields<"
        "$unknown_fields_type$>(),\n"
        "    ptr, ctx);\n"
        "CHK_(ptr != nullptr);\n");
  }
}